

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O2

void __thiscall FShaderManager::ApplyMatrices(FShaderManager *this,VSMatrix *proj,VSMatrix *view)

{
  FShader **ppFVar1;
  int i;
  long lVar2;
  ulong uVar3;
  
  if (gl.legacyMode) {
    (*_ptrc_glMatrixMode)(0x1701);
    (*_ptrc_glLoadMatrixf)(proj->mMatrix);
    (*_ptrc_glMatrixMode)(0x1700);
    (*_ptrc_glLoadMatrixf)(view->mMatrix);
    return;
  }
  for (lVar2 = 0; ppFVar1 = (this->mTextureEffects).Array, lVar2 != 4; lVar2 = lVar2 + 1) {
    FShader::ApplyMatrices(ppFVar1[lVar2],proj,view);
    FShader::ApplyMatrices((this->mTextureEffectsNAT).Array[lVar2],proj,view);
  }
  FShader::ApplyMatrices(ppFVar1[4],proj,view);
  if ((long)gl_fuzztype.Value != 0) {
    FShader::ApplyMatrices((this->mTextureEffects).Array[(long)gl_fuzztype.Value + 4],proj,view);
  }
  for (uVar3 = 0xc; uVar3 < (this->mTextureEffects).Count; uVar3 = uVar3 + 1) {
    FShader::ApplyMatrices((this->mTextureEffects).Array[uVar3],proj,view);
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    FShader::ApplyMatrices(this->mEffectShaders[lVar2],proj,view);
  }
  if (this->mActiveShader != (FShader *)0x0) {
    FShader::Bind(this->mActiveShader);
    return;
  }
  return;
}

Assistant:

void FShaderManager::ApplyMatrices(VSMatrix *proj, VSMatrix *view)
{
	if (gl.legacyMode)
	{
		glMatrixMode(GL_PROJECTION);
		glLoadMatrixf(proj->get());
		glMatrixMode(GL_MODELVIEW);
		glLoadMatrixf(view->get());
	}
	else
	{
		for (int i = 0; i < 4; i++)
		{
			mTextureEffects[i]->ApplyMatrices(proj, view);
			mTextureEffectsNAT[i]->ApplyMatrices(proj, view);
		}
		mTextureEffects[4]->ApplyMatrices(proj, view);
		if (gl_fuzztype != 0)
		{
			mTextureEffects[4 + gl_fuzztype]->ApplyMatrices(proj, view);
		}
		for (unsigned i = 12; i < mTextureEffects.Size(); i++)
		{
			mTextureEffects[i]->ApplyMatrices(proj, view);
		}
		for (int i = 0; i < MAX_EFFECTS; i++)
		{
			mEffectShaders[i]->ApplyMatrices(proj, view);
		}
		if (mActiveShader != NULL) mActiveShader->Bind();
	}
}